

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.cpp
# Opt level: O3

XMLNode * __thiscall ORPG::Core::XMLNode::insert_first_child(XMLNode *this,XMLNode *node)

{
  XMLNode *pXVar1;
  XMLNode *pXVar2;
  
  pXVar1 = this->firstChild;
  if (((pXVar1 != (XMLNode *)0x0 && node != (XMLNode *)0x0) && (node->document == this->document))
     && (pXVar1->document == node->document)) {
    if (pXVar1->nextSib != (XMLNode *)0x0) {
      pXVar2 = pXVar1->prevSib;
      pXVar1->prevSib = node;
      node->prevSib = pXVar2;
      return node;
    }
    pXVar1->nextSib = node;
    return node;
  }
  return (XMLNode *)0x0;
}

Assistant:

XMLNode* XMLNode::insert_first_child(XMLNode* node) {
    return insert_before_node(first_child(), node);
}